

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::JunitReporter::writeSection
          (JunitReporter *this,string *className,string *rootName,SectionNode *sectionNode,
          bool testOkToFail)

{
  XmlWriter *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  pointer pAVar4;
  pointer psVar5;
  bool testOkToFail_00;
  long *plVar6;
  size_type *psVar7;
  _anonymous_namespace_ *this_01;
  undefined7 in_register_00000081;
  AssertionStats *assertion;
  pointer stats;
  pointer psVar8;
  __string_type __str;
  string name;
  ScopedElement e;
  string local_c0;
  string local_a0;
  undefined1 local_80 [28];
  undefined4 local_64;
  string local_60;
  
  local_80._16_8_ = this;
  trim(&local_60,&(sectionNode->stats).sectionInfo.name);
  if (rootName->_M_string_length != 0) {
    pcVar3 = (rootName->_M_dataplus)._M_p;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a0,pcVar3,pcVar3 + rootName->_M_string_length);
    std::__cxx11::string::_M_replace_aux((ulong)&local_a0,local_a0._M_string_length,0,'\x01');
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_a0,(ulong)local_60._M_dataplus._M_p);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_c0.field_2._M_allocated_capacity = *psVar7;
      local_c0.field_2._8_8_ = plVar6[3];
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    }
    else {
      local_c0.field_2._M_allocated_capacity = *psVar7;
      local_c0._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_c0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_60,(string *)&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
  }
  local_64 = (undefined4)CONCAT71(in_register_00000081,testOkToFail);
  if ((((sectionNode->assertions).
        super__Vector_base<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (sectionNode->assertions).
        super__Vector_base<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>._M_impl.
        super__Vector_impl_data._M_finish) || ((sectionNode->stdOut)._M_string_length != 0)) ||
     ((sectionNode->stdErr)._M_string_length != 0)) {
    paVar1 = &local_c0.field_2;
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"testcase","");
    this_00 = (XmlWriter *)(local_80._16_8_ + 0xd8);
    XmlWriter::scopedElement
              ((XmlWriter *)&stack0xffffffffffffffc0,(string *)this_00,(XmlFormatting)&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if (className->_M_string_length == 0) {
      local_c0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"classname","");
      XmlWriter::writeAttribute(this_00,&local_c0,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      local_c0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"name","");
      XmlWriter::writeAttribute<char[5]>(this_00,&local_c0,(char (*) [5])"root");
    }
    else {
      local_c0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"classname","");
      XmlWriter::writeAttribute(this_00,&local_c0,className);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      local_c0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"name","");
      XmlWriter::writeAttribute(this_00,&local_c0,&local_60);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    this_01 = (_anonymous_namespace_ *)0x1fbb3e;
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"time","");
    (anonymous_namespace)::formatDuration_abi_cxx11_
              (&local_a0,this_01,(sectionNode->stats).durationInSeconds);
    XmlWriter::writeAttribute(this_00,&local_c0,&local_a0);
    paVar2 = &local_a0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"status","");
    XmlWriter::writeAttribute<char[4]>(this_00,&local_c0,(char (*) [4])0x1f2add);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((sectionNode->stats).assertions.failedButOk != 0) {
      local_c0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"skipped","");
      XmlWriter::scopedElement((XmlWriter *)local_80,(string *)this_00,(XmlFormatting)&local_c0);
      local_a0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"message","");
      XmlWriter::writeAttribute<char[31]>
                ((XmlWriter *)local_80._0_8_,&local_a0,
                 (char (*) [31])"TEST_CASE tagged with !mayfail");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != paVar2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
    }
    pAVar4 = (sectionNode->assertions).
             super__Vector_base<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (stats = (sectionNode->assertions).
                 super__Vector_base<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>.
                 _M_impl.super__Vector_impl_data._M_start; stats != pAVar4; stats = stats + 1) {
      writeAssertion((JunitReporter *)local_80._16_8_,stats);
    }
    paVar1 = &local_c0.field_2;
    if ((sectionNode->stdOut)._M_string_length != 0) {
      local_c0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"system-out","");
      XmlWriter::scopedElement((XmlWriter *)local_80,(string *)this_00,(XmlFormatting)&local_c0);
      trim(&local_a0,&sectionNode->stdOut);
      XmlWriter::writeText((XmlWriter *)local_80._0_8_,&local_a0,Newline);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != paVar2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
    }
    if ((sectionNode->stdErr)._M_string_length != 0) {
      local_c0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"system-err","");
      XmlWriter::scopedElement((XmlWriter *)local_80,(string *)this_00,(XmlFormatting)&local_c0);
      trim(&local_a0,&sectionNode->stdErr);
      XmlWriter::writeText((XmlWriter *)local_80._0_8_,&local_a0,Newline);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != paVar2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&stack0xffffffffffffffc0);
  }
  psVar8 = (sectionNode->childSections).
           super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar5 = (sectionNode->childSections).
           super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar8 != psVar5) {
    testOkToFail_00 = local_64._0_1_;
    do {
      if (className->_M_string_length == 0) {
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"");
        writeSection((JunitReporter *)local_80._16_8_,&local_60,&local_c0,
                     (psVar8->
                     super___shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr,testOkToFail_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        writeSection((JunitReporter *)local_80._16_8_,className,&local_60,
                     (psVar8->
                     super___shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr,testOkToFail_00);
      }
      psVar8 = psVar8 + 1;
    } while (psVar8 != psVar5);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void JunitReporter::writeSection( std::string const& className,
                                      std::string const& rootName,
                                      SectionNode const& sectionNode,
                                      bool testOkToFail) {
        std::string name = trim( sectionNode.stats.sectionInfo.name );
        if( !rootName.empty() )
            name = rootName + '/' + name;

        if( !sectionNode.assertions.empty() ||
            !sectionNode.stdOut.empty() ||
            !sectionNode.stdErr.empty() ) {
            XmlWriter::ScopedElement e = xml.scopedElement( "testcase" );
            if( className.empty() ) {
                xml.writeAttribute( "classname", name );
                xml.writeAttribute( "name", "root" );
            }
            else {
                xml.writeAttribute( "classname", className );
                xml.writeAttribute( "name", name );
            }
            xml.writeAttribute( "time", formatDuration( sectionNode.stats.durationInSeconds ) );
            // This is not ideal, but it should be enough to mimic gtest's
            // junit output.
            // Ideally the JUnit reporter would also handle `skipTest`
            // events and write those out appropriately.
            xml.writeAttribute( "status", "run" );

            if (sectionNode.stats.assertions.failedButOk) {
                xml.scopedElement("skipped")
                    .writeAttribute("message", "TEST_CASE tagged with !mayfail");
            }

            writeAssertions( sectionNode );

            if( !sectionNode.stdOut.empty() )
                xml.scopedElement( "system-out" ).writeText( trim( sectionNode.stdOut ), XmlFormatting::Newline );
            if( !sectionNode.stdErr.empty() )
                xml.scopedElement( "system-err" ).writeText( trim( sectionNode.stdErr ), XmlFormatting::Newline );
        }
        for( auto const& childNode : sectionNode.childSections )
            if( className.empty() )
                writeSection( name, "", *childNode, testOkToFail );
            else
                writeSection( className, name, *childNode, testOkToFail );
    }